

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmosSyncChannel_Mixer.cpp
# Opt level: O2

AtmosSyncChannelMixer * __thiscall
ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels(AtmosSyncChannelMixer *this)

{
  SilenceDataProvider *this_00;
  int iVar1;
  uint uVar2;
  long in_RSI;
  AudioDescriptor tmpDesc;
  pair<unsigned_int,_ASDCP::PCMDataProviderInterface_*> local_88 [6];
  
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  tmpDesc.EditRate.Numerator = 0;
  tmpDesc.EditRate.Denominator = 0;
  tmpDesc.AudioSamplingRate.Numerator = 0;
  tmpDesc.AudioSamplingRate.Denominator = 0;
  iVar1 = *(int *)(in_RSI + 0x78) + -0xd;
  if (iVar1 != 0) {
    this_00 = (SilenceDataProvider *)operator_new(0x40);
    uVar2 = -iVar1;
    SilenceDataProvider::SilenceDataProvider
              (this_00,(ui16_t)uVar2,*(ui16_t *)(in_RSI + 0x60),*(ui32_t *)(in_RSI + 0x50),
               (Rational *)(in_RSI + 0x48));
    (*(this_00->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface[4])
              (local_88,this_00,&tmpDesc);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_88);
    Kumu::Result_t::~Result_t((Result_t *)local_88);
    if (*(int *)&this->_vptr_AtmosSyncChannelMixer < 0) {
      (*(this_00->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface[1])(this_00);
    }
    else {
      *(int *)(in_RSI + 100) = *(int *)(in_RSI + 100) + tmpDesc.BlockAlign;
      *(int *)(in_RSI + 0x78) = *(int *)(in_RSI + 0x78) + tmpDesc.ChannelCount;
      local_88[0].first = uVar2;
      local_88[0].second = (PCMDataProviderInterface *)this_00;
      std::
      vector<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>,std::allocator<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>>>
      ::emplace_back<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>>
                ((vector<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>,std::allocator<std::pair<unsigned_int,ASDCP::PCMDataProviderInterface*>>>
                  *)(in_RSI + 0x20),local_88);
      local_88[0]._0_8_ = this_00;
      std::vector<ASDCP::PCMDataProviderInterface*,std::allocator<ASDCP::PCMDataProviderInterface*>>
      ::emplace_back<ASDCP::PCMDataProviderInterface*>
                ((vector<ASDCP::PCMDataProviderInterface*,std::allocator<ASDCP::PCMDataProviderInterface*>>
                  *)(in_RSI + 8),(PCMDataProviderInterface **)local_88);
      if (*(int *)(in_RSI + 0x78) != 0xd) {
        __assert_fail("m_ChannelCount == (ATMOS::SYNC_CHANNEL - 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AtmosSyncChannel_Mixer.cpp"
                      ,0xe6,"Result_t ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels()");
      }
    }
  }
  return this;
}

Assistant:

Result_t
ASDCP::AtmosSyncChannelMixer::MixInSilenceChannels()
{
  Result_t result = RESULT_OK;
  PCM::AudioDescriptor tmpDesc;
  ui32_t numSilenceChannels = ATMOS::SYNC_CHANNEL - m_ChannelCount - 1;
  if (numSilenceChannels > 0)
  {
    mem_ptr<SilenceDataProvider> I = new SilenceDataProvider(numSilenceChannels,
                                                             m_ADesc.QuantizationBits,
                                                             m_ADesc.AudioSamplingRate.Numerator,
                                                             m_ADesc.EditRate);
    result = I->FillAudioDescriptor(tmpDesc);
    if ( ASDCP_SUCCESS(result) )
    {
      m_ADesc.BlockAlign += tmpDesc.BlockAlign;
      m_ChannelCount += tmpDesc.ChannelCount;
      m_outputs.push_back(std::make_pair(numSilenceChannels, I.get()));
      m_inputs.push_back(I);
      I.release();
      assert(m_ChannelCount == (ATMOS::SYNC_CHANNEL - 1));
    }
  }
  return result;
}